

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O3

bool __thiscall OSToken::deleteObject(OSToken *this,OSObject *object)

{
  _Rb_tree_header *p_Var1;
  Directory *pDVar2;
  int iVar3;
  _Base_ptr p_Var4;
  ObjectFile *this_00;
  _Base_ptr p_Var5;
  char cVar6;
  pair<std::_Rb_tree_iterator<OSObject_*>,_std::_Rb_tree_iterator<OSObject_*>_> pVar7;
  string objectFilename;
  string lockFilename;
  MutexLocker lock;
  OSObject *local_c8;
  string local_c0;
  string local_a0;
  MutexLocker local_80;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (this->valid != true) {
    return false;
  }
  p_Var4 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_c8 = object;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(OSObject **)(p_Var4 + 1) >= object) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(OSObject **)(p_Var4 + 1) < object];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(OSObject **)(p_Var5 + 1) <= object)) {
      MutexLocker::MutexLocker(&local_80,this->tokenMutex);
      if ((object == (OSObject *)0x0) ||
         (this_00 = (ObjectFile *)__dynamic_cast(object,&OSObject::typeinfo,&ObjectFile::typeinfo,0)
         , this_00 == (ObjectFile *)0x0)) {
        cVar6 = '\0';
        softHSMLog(3,"deleteObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x18d,"Object type not compatible with this token class 0x%08X",object);
      }
      else {
        ObjectFile::invalidate(this_00);
        ObjectFile::getFilename_abi_cxx11_(&local_c0,this_00);
        pDVar2 = this->tokenDir;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        iVar3 = Directory::remove(pDVar2,(char *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if ((char)iVar3 == '\0') {
          cVar6 = '\0';
          softHSMLog(3,"deleteObject",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x19b,"Failed to delete object file %s",local_c0._M_dataplus._M_p);
        }
        else {
          ObjectFile::getLockname_abi_cxx11_(&local_a0,this_00);
          pDVar2 = this->tokenDir;
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          iVar3 = Directory::remove(pDVar2,(char *)local_70);
          cVar6 = (char)iVar3;
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          if (cVar6 == '\0') {
            softHSMLog(3,"deleteObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x1a6,"Failed to delete lock file %s",local_a0._M_dataplus._M_p);
          }
          else {
            pVar7 = std::
                    _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                    ::equal_range(&(this->objects)._M_t,&local_c8);
            std::
            _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
            ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar7.first._M_node,
                           (_Base_ptr)pVar7.second._M_node);
            softHSMLog(7,"deleteObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x1ad,"Deleted object %s",local_c0._M_dataplus._M_p);
            Generation::update(this->gen);
            Generation::commit(this->gen);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      MutexLocker::~MutexLocker(&local_80);
      return (bool)cVar6;
    }
  }
  softHSMLog(3,"deleteObject",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
             ,0x183,"Cannot delete non-existent object 0x%08X",object);
  return false;
}

Assistant:

bool OSToken::deleteObject(OSObject* object)
{
	if (!valid) return false;

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	MutexLocker lock(tokenMutex);

	ObjectFile* fileObject = dynamic_cast<ObjectFile*>(object);
	if (fileObject == NULL)
	{
		ERROR_MSG("Object type not compatible with this token class 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	fileObject->invalidate();

	// Retrieve the filename of the object
	std::string objectFilename = fileObject->getFilename();

	// Attempt to delete the file
	if (!tokenDir->remove(objectFilename))
	{
		ERROR_MSG("Failed to delete object file %s", objectFilename.c_str());

		return false;
	}

	// Retrieve the filename of the lock
	std::string lockFilename = fileObject->getLockname();

	// Attempt to delete the lock
	if (!tokenDir->remove(lockFilename))
	{
		ERROR_MSG("Failed to delete lock file %s", lockFilename.c_str());

		return false;
	}

	objects.erase(object);

	DEBUG_MSG("Deleted object %s", objectFilename.c_str());

	gen->update();

	gen->commit();

	return true;
}